

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O0

void Sat_SolverWriteDimacs
               (sat_solver *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  FILE *local_60;
  int local_54;
  int local_50;
  int nUnits;
  int k;
  int i;
  clause *c;
  FILE *pFile;
  Sat_Mem_t *pMem;
  int incrementVars_local;
  lit *assumpEnd_local;
  lit *assumpBegin_local;
  char *pFileName_local;
  sat_solver *p_local;
  
  local_54 = 0;
  for (nUnits = 0; nUnits < p->size; nUnits = nUnits + 1) {
    if ((p->levels[nUnits] == 0) && (p->assigns[nUnits] != '\x03')) {
      local_54 = local_54 + 1;
    }
  }
  if (pFileName == (char *)0x0) {
    local_60 = _stdout;
  }
  else {
    local_60 = fopen(pFileName,"wb");
  }
  if (local_60 == (FILE *)0x0) {
    printf("Sat_SolverWriteDimacs(): Cannot open the ouput file.\n");
  }
  else {
    uVar1 = p->size;
    iVar2 = Sat_MemEntryNum(&p->Mem,0);
    iVar3 = Sat_MemEntryNum(&p->Mem,1);
    fprintf(local_60,"p cnf %d %d\n",(ulong)uVar1,
            (ulong)(uint)(iVar2 + -1 + iVar3 + local_54 +
                         (int)((long)assumpEnd - (long)assumpBegin >> 2)));
    for (nUnits = 0; nUnits <= (p->Mem).iPage[0]; nUnits = nUnits + 2) {
      local_50 = 2;
      while( true ) {
        iVar2 = Sat_MemLimit((p->Mem).pPages[nUnits]);
        bVar6 = false;
        if (local_50 < iVar2) {
          _k = Sat_MemClause(&p->Mem,nUnits,local_50);
          bVar6 = _k != (clause *)0x0;
        }
        if (!bVar6) break;
        if ((nUnits != 0) || (local_50 != 2)) {
          Sat_SolverClauseWriteDimacs((FILE *)local_60,_k,incrementVars);
        }
        iVar2 = Sat_MemClauseSize(_k);
        local_50 = iVar2 + local_50;
      }
    }
    for (nUnits = 0; nUnits < p->size; nUnits = nUnits + 1) {
      if ((p->levels[nUnits] == 0) && (p->assigns[nUnits] != '\x03')) {
        pcVar4 = "";
        if (p->assigns[nUnits] == '\x01') {
          pcVar4 = "-";
        }
        pcVar5 = "";
        if (incrementVars != 0) {
          pcVar5 = " 0";
        }
        fprintf(local_60,"%s%d%s\n",pcVar4,(ulong)(nUnits + (uint)(0 < incrementVars)),pcVar5);
      }
    }
    assumpEnd_local = assumpBegin;
    if (assumpBegin != (lit *)0x0) {
      for (; assumpEnd_local != assumpEnd; assumpEnd_local = assumpEnd_local + 1) {
        iVar2 = lit_sign(*assumpEnd_local);
        pcVar4 = "";
        if (iVar2 != 0) {
          pcVar4 = "-";
        }
        iVar2 = lit_var(*assumpEnd_local);
        pcVar5 = "";
        if (incrementVars != 0) {
          pcVar5 = " 0";
        }
        fprintf(local_60,"%s%d%s\n",pcVar4,(ulong)(iVar2 + (uint)(0 < incrementVars)),pcVar5);
      }
    }
    fprintf(local_60,"\n");
    if (pFileName != (char *)0x0) {
      fclose(local_60);
    }
  }
  return;
}

Assistant:

void Sat_SolverWriteDimacs( sat_solver * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    if ( pFileName ) fclose( pFile );
}